

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_SurfaceCurvature __thiscall
ON_SubDMeshFragment::CornerCurvature(ON_SubDMeshFragment *this,uint grid_corner_index)

{
  uint uVar1;
  uint *puVar2;
  ON_SurfaceCurvature *pOVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  ON_SurfaceCurvature OVar7;
  
  if ((grid_corner_index < 4) && (puVar2 = (this->m_grid).m_S, puVar2 != (uint *)0x0)) {
    bVar5 = (this->m_vertex_capacity_etc & 0x4000) != 0;
    pOVar3 = this->m_K;
    bVar6 = this->m_K_stride != 0;
    uVar1 = puVar2[(this->m_grid).m_side_segment_count * grid_corner_index];
    bVar4 = uVar1 < (this->m_vertex_count_etc & 0x1fff);
    if (bVar4 && (bVar6 && (pOVar3 != (ON_SurfaceCurvature *)0x0 && bVar5))) {
      in_XMM0_Qa = pOVar3[uVar1].k1;
      in_XMM1_Qa = pOVar3[uVar1].k2;
    }
    if (bVar4 && (bVar6 && (pOVar3 != (ON_SurfaceCurvature *)0x0 && bVar5))) goto LAB_00613e39;
  }
  in_XMM0_Qa = ON_SurfaceCurvature::Nan.k1;
  in_XMM1_Qa = ON_SurfaceCurvature::Nan.k2;
LAB_00613e39:
  OVar7.k2 = in_XMM1_Qa;
  OVar7.k1 = in_XMM0_Qa;
  return OVar7;
}

Assistant:

const ON_SurfaceCurvature ON_SubDMeshFragment::CornerCurvature(unsigned int grid_corner_index) const
{
  for (;;)
  {
    if (grid_corner_index >= 4 || nullptr == m_grid.m_S)
      break;

    const unsigned n = this->CurvatureCount();
    const unsigned int i = m_grid.m_S[grid_corner_index * m_grid.m_side_segment_count];
    if (i >= n)
      break;

    return m_K[i];
  }
  return ON_SurfaceCurvature::Nan;
}